

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O1

void __thiscall
duckdb::BatchInsertGlobalState::BatchInsertGlobalState
          (BatchInsertGlobalState *this,ClientContext *context,DuckTableEntry *table,
          idx_t minimum_memory_per_thread)

{
  int iVar1;
  undefined4 extraout_var;
  idx_t iVar2;
  
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.can_block._M_base._M_i = true;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __align = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base.
           _M_mutex + 0x10) = 0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.
  __data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_GlobalSinkState).state = READY;
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__BatchInsertGlobalState_024a7a10;
  BatchMemoryManager::BatchMemoryManager(&this->memory_manager,context,minimum_memory_per_thread);
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->task_manager).task_lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  *(undefined8 *)((long)&(this->task_manager).task_lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->task_manager).task_lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->task_manager).task_lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->task_manager).task_lock.super___mutex_base._M_mutex + 8) = 0;
  (this->task_manager).task_queue.c.
  super__Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
  ::_M_initialize_map((_Deque_base<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>_>_>
                       *)&(this->task_manager).task_queue,0);
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->table = table;
  this->insert_count = 0;
  (this->collections).
  super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
  super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->collections).
  super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
  super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->collections).
  super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
  super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->collections).
           super_vector<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>.
           super__Vector_base<duckdb::RowGroupBatchEntry,_std::allocator<duckdb::RowGroupBatchEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  *(undefined8 *)((long)&this->next_start + 1) = 0;
  this->minimum_memory_per_thread = minimum_memory_per_thread;
  iVar1 = (*(table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(table);
  iVar2 = DataTable::GetRowGroupSize((DataTable *)CONCAT44(extraout_var,iVar1));
  this->row_group_size = iVar2;
  return;
}

Assistant:

BatchInsertGlobalState(ClientContext &context, DuckTableEntry &table, const idx_t minimum_memory_per_thread)
	    : memory_manager(context, minimum_memory_per_thread), table(table), insert_count(0),
	      optimistically_written(false), minimum_memory_per_thread(minimum_memory_per_thread) {
		row_group_size = table.GetStorage().GetRowGroupSize();
	}